

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackSTGZGenerator.cxx
# Opt level: O3

int __thiscall cmCPackSTGZGenerator::GenerateHeader(cmCPackSTGZGenerator *this,ostream *os)

{
  pointer pcVar1;
  cmCPackLog *pcVar2;
  cmCPackArchiveGenerator *pcVar3;
  ostream *poVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  _Alloc_hider _Var9;
  long *plVar10;
  string line;
  string licenseText;
  string packageHeaderText;
  string res;
  string inFile;
  string inLicFile;
  char headerLengthTag [26];
  char buffer [1024];
  ifstream ilfs;
  ostringstream str;
  ifstream ifs;
  string local_ac8;
  char *local_aa8;
  undefined8 local_aa0;
  char local_a98;
  undefined7 uStack_a97;
  cmCPackArchiveGenerator *local_a88;
  undefined1 *local_a80;
  undefined8 local_a78;
  undefined1 local_a70;
  undefined7 uStack_a6f;
  string local_a60;
  ostream *local_a40;
  long *local_a38;
  long local_a28 [2];
  long *local_a18 [2];
  long local_a08 [2];
  long *local_9f8 [2];
  long local_9e8 [2];
  char local_9d8 [32];
  undefined1 local_9b8 [112];
  ios_base local_948 [912];
  long *local_5b8 [2];
  long local_5a8 [63];
  ostringstream local_3b0 [112];
  ios_base local_340 [264];
  allocator local_238 [520];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_9b8,"Writing header",0xe);
  std::ios::widen((char)(ostringstream *)local_9b8 + (char)*(undefined8 *)(local_9b8._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_9b8);
  std::ostream::flush();
  pcVar2 = (this->super_cmCPackTGZGenerator).super_cmCPackArchiveGenerator.super_cmCPackGenerator.
           Logger;
  std::__cxx11::stringbuf::str();
  plVar10 = local_5b8[0];
  sVar7 = strlen((char *)local_5b8[0]);
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackSTGZGenerator.cxx"
                  ,0x44,(char *)plVar10,sVar7);
  if (local_5b8[0] != local_5a8) {
    operator_delete(local_5b8[0],local_5a8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9b8);
  std::ios_base::~ios_base(local_948);
  std::__cxx11::ostringstream::ostringstream(local_3b0);
  pcVar1 = local_9b8 + 0x10;
  local_9b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9b8,"CPACK_RESOURCE_FILE_LICENSE","");
  pcVar8 = cmCPackGenerator::GetOption((cmCPackGenerator *)this,(string *)local_9b8);
  std::__cxx11::string::string((string *)local_9f8,pcVar8,(allocator *)local_5b8);
  if ((pointer)local_9b8._0_8_ != pcVar1) {
    operator_delete((void *)local_9b8._0_8_,local_9b8._16_8_ + 1);
  }
  local_ac8._M_dataplus._M_p = (pointer)&local_ac8.field_2;
  local_ac8._M_string_length = 0;
  local_ac8.field_2._M_local_buf[0] = '\0';
  local_a88 = (cmCPackArchiveGenerator *)this;
  local_a40 = os;
  std::ifstream::ifstream(local_5b8,(char *)local_9f8[0],_S_in);
  local_aa8 = &local_a98;
  local_aa0 = 0;
  local_a98 = '\0';
  while( true ) {
    bVar5 = cmsys::SystemTools::GetLineFromStream((istream *)local_5b8,&local_ac8,(bool *)0x0,-1);
    if (!bVar5) break;
    local_9b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_9b8,local_ac8._M_dataplus._M_p,
               local_ac8._M_dataplus._M_p + local_ac8._M_string_length);
    std::__cxx11::string::append((char *)local_9b8);
    std::__cxx11::string::_M_append((char *)&local_aa8,local_9b8._0_8_);
    if ((pointer)local_9b8._0_8_ != pcVar1) {
      operator_delete((void *)local_9b8._0_8_,local_9b8._16_8_ + 1);
    }
  }
  local_9b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9b8,"CPACK_RESOURCE_FILE_LICENSE_CONTENT","");
  pcVar3 = local_a88;
  cmCPackGenerator::SetOptionIfNotSet
            (&local_a88->super_cmCPackGenerator,(string *)local_9b8,local_aa8);
  if ((pointer)local_9b8._0_8_ != pcVar1) {
    operator_delete((void *)local_9b8._0_8_,local_9b8._16_8_ + 1);
  }
  builtin_strncpy(local_9d8 + 0x10,"LENGTH###",10);
  builtin_strncpy(local_9d8,"###CPACK_HEADER_",0x10);
  local_9b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9b8,"CPACK_STGZ_HEADER_FILE","");
  pcVar8 = cmCPackGenerator::GetOption(&pcVar3->super_cmCPackGenerator,(string *)local_9b8);
  std::__cxx11::string::string((string *)local_a18,pcVar8,local_238);
  if ((pointer)local_9b8._0_8_ != pcVar1) {
    operator_delete((void *)local_9b8._0_8_,local_9b8._16_8_ + 1);
  }
  std::ifstream::ifstream(local_238,(char *)local_a18[0],_S_in);
  local_a80 = &local_a70;
  local_a78 = 0;
  local_a70 = 0;
  while( true ) {
    bVar5 = cmsys::SystemTools::GetLineFromStream((istream *)local_238,&local_ac8,(bool *)0x0,-1);
    pcVar3 = local_a88;
    if (!bVar5) break;
    local_9b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_9b8,local_ac8._M_dataplus._M_p,
               local_ac8._M_dataplus._M_p + local_ac8._M_string_length);
    std::__cxx11::string::append((char *)local_9b8);
    std::__cxx11::string::_M_append((char *)&local_a80,local_9b8._0_8_);
    if ((pointer)local_9b8._0_8_ != pcVar1) {
      operator_delete((void *)local_9b8._0_8_,local_9b8._16_8_ + 1);
    }
  }
  local_a60._M_string_length = 0;
  local_a60.field_2._M_local_buf[0] = '\0';
  local_a60._M_dataplus._M_p = (pointer)&local_a60.field_2;
  (*(local_a88->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xe])
            (local_a88,&local_a80,&local_a60);
  iVar6 = 0;
  _Var9._M_p = local_a60._M_dataplus._M_p;
  do {
    if (*_Var9._M_p == '\n') {
      iVar6 = iVar6 + 1;
    }
    else if (*_Var9._M_p == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_9b8,"Number of lines: ",0x11);
      plVar10 = (long *)std::ostream::operator<<(local_9b8,iVar6 + 1U);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
      pcVar2 = (pcVar3->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      plVar10 = local_a38;
      sVar7 = strlen((char *)local_a38);
      cmCPackLog::Log(pcVar2,4,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackSTGZGenerator.cxx"
                      ,0x6a,(char *)plVar10,sVar7);
      if (local_a38 != local_a28) {
        operator_delete(local_a38,local_a28[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9b8);
      std::ios_base::~ios_base(local_948);
      sprintf(local_9b8,"%d",(ulong)(iVar6 + 1U));
      cmsys::SystemTools::ReplaceString(&local_a60,local_9d8,local_9b8);
      poVar4 = local_a40;
      std::__ostream_insert<char,std::char_traits<char>>
                (local_a40,local_a60._M_dataplus._M_p,local_a60._M_string_length);
      iVar6 = cmCPackArchiveGenerator::GenerateHeader(pcVar3,poVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a60._M_dataplus._M_p != &local_a60.field_2) {
        operator_delete(local_a60._M_dataplus._M_p,
                        CONCAT71(local_a60.field_2._M_allocated_capacity._1_7_,
                                 local_a60.field_2._M_local_buf[0]) + 1);
      }
      if (local_a80 != &local_a70) {
        operator_delete(local_a80,CONCAT71(uStack_a6f,local_a70) + 1);
      }
      std::ifstream::~ifstream(local_238);
      if (local_a18[0] != local_a08) {
        operator_delete(local_a18[0],local_a08[0] + 1);
      }
      if (local_aa8 != &local_a98) {
        operator_delete(local_aa8,CONCAT71(uStack_a97,local_a98) + 1);
      }
      std::ifstream::~ifstream(local_5b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
        operator_delete(local_ac8._M_dataplus._M_p,
                        CONCAT71(local_ac8.field_2._M_allocated_capacity._1_7_,
                                 local_ac8.field_2._M_local_buf[0]) + 1);
      }
      if (local_9f8[0] != local_9e8) {
        operator_delete(local_9f8[0],local_9e8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_3b0);
      std::ios_base::~ios_base(local_340);
      return iVar6;
    }
    _Var9._M_p = _Var9._M_p + 1;
  } while( true );
}

Assistant:

int cmCPackSTGZGenerator::GenerateHeader(std::ostream* os)
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Writing header" << std::endl);
  std::ostringstream str;
  int counter = 0;

  std::string inLicFile = this->GetOption("CPACK_RESOURCE_FILE_LICENSE");
  std::string line;
  cmsys::ifstream ilfs(inLicFile.c_str());
  std::string licenseText;
  while (cmSystemTools::GetLineFromStream(ilfs, line)) {
    licenseText += line + "\n";
  }
  this->SetOptionIfNotSet("CPACK_RESOURCE_FILE_LICENSE_CONTENT",
                          licenseText.c_str());

  const char headerLengthTag[] = "###CPACK_HEADER_LENGTH###";

  // Create the header
  std::string inFile = this->GetOption("CPACK_STGZ_HEADER_FILE");
  cmsys::ifstream ifs(inFile.c_str());
  std::string packageHeaderText;
  while (cmSystemTools::GetLineFromStream(ifs, line)) {
    packageHeaderText += line + "\n";
  }

  // Configure in the values
  std::string res;
  this->ConfigureString(packageHeaderText, res);

  // Count the lines
  const char* ptr = res.c_str();
  while (*ptr) {
    if (*ptr == '\n') {
      counter++;
    }
    ++ptr;
  }
  counter++;
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Number of lines: " << counter
                                                           << std::endl);
  char buffer[1024];
  sprintf(buffer, "%d", counter);
  cmSystemTools::ReplaceString(res, headerLengthTag, buffer);

  // Write in file
  *os << res;
  return this->Superclass::GenerateHeader(os);
}